

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::PostDepthShaderCase::PostDepthShaderCase(PostDepthShaderCase *this,Context *context)

{
  Context *context_local;
  PostDepthShaderCase *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"PostDepthShader",
             "Verifies if shader functionality added in ARB_post_depth_coverage extension works as expected"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__PostDepthShaderCase_0324d900;
  std::__cxx11::string::string((string *)&this->m_vertShader);
  std::__cxx11::string::string((string *)&this->m_fragShader1);
  std::__cxx11::string::string((string *)&this->m_fragShader2);
  std::__cxx11::string::string((string *)&this->m_fragShader3);
  std::__cxx11::string::string((string *)&this->m_fragShader4);
  return;
}

Assistant:

PostDepthShaderCase::PostDepthShaderCase(deqp::Context& context)
	: TestCase(context, "PostDepthShader",
			   "Verifies if shader functionality added in ARB_post_depth_coverage extension works as expected")
{
	/* Left blank intentionally */
}